

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O1

uint __thiscall LinearScan::GetSpillCost(LinearScan *this,Lifetime *lifetime)

{
  Loop *pLVar1;
  code *pcVar2;
  bool bVar3;
  BOOLEAN BVar4;
  uint uVar5;
  uint32 uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint32 *puVar10;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  undefined4 *puVar11;
  uint32 uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  
  pLVar1 = this->curLoop;
  if (pLVar1 == (Loop *)0x0) {
LAB_0058e36f:
    puVar10 = &lifetime->useCount;
LAB_0058e38d:
    uVar12 = *puVar10;
  }
  else {
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,RegionUseCountPhase);
    if (bVar3) goto LAB_0058e36f;
    if (lifetime->regionUseCount != (uint32 *)0x0) {
      puVar10 = lifetime->regionUseCount + pLVar1->loopNumber;
      goto LAB_0058e38d;
    }
    uVar12 = 0;
  }
  uVar5 = this->loopNest;
  uVar9 = uVar5 * 0x8000 - 0x28000;
  if (uVar5 < 6) {
    uVar9 = 1 << ((char)uVar5 * '\x03' & 0x1fU);
  }
  if ((lifetime->reg != RegNOREG) && ((lifetime->field_0x9c & 1) == 0)) {
    uVar5 = lifetime->allDefsCost;
    if (uVar9 < lifetime->allDefsCost) {
      uVar5 = uVar9;
    }
    uVar12 = uVar12 + uVar5;
    if (this->curLoop != (Loop *)0x0) {
      bVar3 = StackSym::IsConst(lifetime->sym);
      if (!bVar3) {
        BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                          ((this->curLoop->regAlloc).liveOnBackEdgeSyms,
                           (lifetime->sym->super_Sym).m_id);
        if (BVar4 == '\0') {
          uVar9 = 0;
        }
        uVar12 = uVar12 + uVar9;
      }
    }
  }
  uVar6 = IR::Instr::GetNumber(this->currentInstr);
  uVar5 = lifetime->end;
  if (lifetime->end < uVar6) {
    uVar5 = uVar6;
  }
  uVar13 = lifetime->totalOpHelperLengthByEnd;
  if ((this->curLoop != (Loop *)0x0) && ((this->curLoop->regAlloc).loopEnd < uVar5)) {
    this_00 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    uVar7 = JITTimeFunctionBody::GetSourceContextId(this_00);
    this_01 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    uVar8 = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,RegionUseCountPhase,uVar7,uVar8);
    if (!bVar3) {
      uVar5 = (this->curLoop->regAlloc).loopEnd;
      uVar13 = (this->curLoop->regAlloc).helperLength;
    }
  }
  uVar7 = this->totalOpHelperFullVisitedLength;
  uVar8 = CurrentOpHelperVisitedLength(this,this->currentInstr);
  uVar9 = uVar8 + uVar7;
  uVar14 = uVar13 - uVar9;
  if (uVar13 < uVar9) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0xdfd,
                       "(lifetimeTotalOpHelperFullVisitedLength >= totalOpHelperVisitedLength)",
                       "lifetimeTotalOpHelperFullVisitedLength >= totalOpHelperVisitedLength");
    if (!bVar3) goto LAB_0058e5f1;
    *puVar11 = 0;
  }
  uVar9 = (uVar5 - uVar6) + 1;
  if (uVar9 < uVar14) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0xdff,"(length >= lifetimeHelperLength)","length >= lifetimeHelperLength");
    if (!bVar3) {
LAB_0058e5f1:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar11 = 0;
  }
  uVar15 = 0x41;
  if (uVar9 != uVar14) {
    uVar15 = ((uVar5 - uVar6) - uVar14) + 0x41;
  }
  uVar15 = (uVar12 << 0xd) / uVar15;
  if ((*(ushort *)&lifetime->field_0x9c >> 9 & 1) != 0) {
    uVar15 = (uVar15 << 2) / 5;
  }
  uVar15 = uVar15 >> ((byte)(*(ushort *)&lifetime->field_0x9c >> 10) & 1);
  bVar3 = StackSym::IsConst(lifetime->sym);
  uVar13 = uVar15 >> 4;
  if (!bVar3) {
    uVar13 = uVar15;
  }
  return uVar13;
}

Assistant:

uint
LinearScan::GetSpillCost(Lifetime *lifetime)
{
    uint useCount = lifetime->GetRegionUseCount(this->curLoop);
    uint spillCost;
    // Get local spill cost.  Ignore helper blocks as we'll also need compensation on the main path.
    uint localUseCost = LinearScan::GetUseSpillCost(this->loopNest, false);

    if (lifetime->reg && !lifetime->isSpilled)
    {
        // If it is in a reg, we'll need a store
        if (localUseCost >= lifetime->allDefsCost)
        {
            useCount += lifetime->allDefsCost;
        }
        else
        {
            useCount += localUseCost;
        }

        if (this->curLoop && !lifetime->sym->IsConst()
            && this->curLoop->regAlloc.liveOnBackEdgeSyms->Test(lifetime->sym->m_id))
        {
            // If we spill here, we'll need to insert a load at the bottom of the loop
            // (it would be nice to be able to check is was in a reg at the top of the loop)...
            useCount += localUseCost;
        }
    }

    // When comparing 2 lifetimes, we don't really care about the actual length of the lifetimes.
    // What matters is how much longer will they use the register.
    const uint start = currentInstr->GetNumber();
    uint end = max(start, lifetime->end);
    uint lifetimeTotalOpHelperFullVisitedLength = lifetime->totalOpHelperLengthByEnd;

    if (this->curLoop && this->curLoop->regAlloc.loopEnd < end && !PHASE_OFF(Js::RegionUseCountPhase, this->func))
    {
        end = this->curLoop->regAlloc.loopEnd;
        lifetimeTotalOpHelperFullVisitedLength  = this->curLoop->regAlloc.helperLength;
    }
    uint length = end - start + 1;

    // Exclude helper block length since helper block paths are typically infrequently taken paths and not as important
    const uint totalOpHelperVisitedLength = this->totalOpHelperFullVisitedLength + CurrentOpHelperVisitedLength(currentInstr);
    Assert(lifetimeTotalOpHelperFullVisitedLength >= totalOpHelperVisitedLength);
    const uint lifetimeHelperLength = lifetimeTotalOpHelperFullVisitedLength - totalOpHelperVisitedLength;
    Assert(length >= lifetimeHelperLength);
    length -= lifetimeHelperLength;
    if(length == 0)
    {
        length = 1;
    }

    // Add a base length so that the difference between a length of 1 and a length of 2 is not so large
#ifdef _M_X64
    length += 64;
#else
    length += 16;
#endif

    spillCost = (useCount << 13) / length;

    if (lifetime->isSecondChanceAllocated)
    {
        // Second chance allocation have additional overhead, so de-prioritize them
        // Note: could use more tuning...
        spillCost = spillCost * 4/5;
    }
    if (lifetime->isCheapSpill)
    {
        // This lifetime will get spilled eventually, so lower the spill cost to favor other lifetimes
        // Note: could use more tuning...
        spillCost /= 2;
    }

    if (lifetime->sym->IsConst())
    {
        spillCost = spillCost / 16;
    }

    return spillCost;
}